

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Modf::doApply
          (IRet *__return_storage_ptr__,Modf *this,EvalContext *param_1,IArgs *iargs)

{
  Interval *this_00;
  undefined1 auVar1 [16];
  bool bVar2;
  Interval *pIVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  undefined8 extraout_XMM0_Qb;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double intPart;
  double local_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  Interval local_48;
  
  this_00 = iargs->b;
  local_70 = 0.0;
  pIVar3 = iargs->a;
  dVar7 = pIVar3->m_lo;
  dVar6 = pIVar3->m_hi;
  if (dVar7 <= dVar6) {
    local_58 = dVar7;
    local_68 = modf(dVar7,&local_70);
    uStack_60 = extraout_XMM0_Qb;
    dVar7 = modf(dVar6,&local_70);
    bVar2 = NAN(local_68) || NAN(dVar7);
    uVar4 = -(ulong)NAN(dVar7);
    uVar5 = -(ulong)NAN(local_68);
    dVar9 = (double)(uVar4 & 0x7ff0000000000000 | ~uVar4 & (ulong)dVar7);
    dVar10 = (double)(uVar5 & 0xfff0000000000000 | ~uVar5 & (ulong)local_68);
    auVar8._0_8_ = uVar4 & 0xfff0000000000000;
    auVar8._8_8_ = uVar5 & 0x7ff0000000000000;
    auVar1._8_8_ = ~uVar5 & (ulong)local_68;
    auVar1._0_8_ = ~uVar4 & (ulong)dVar7;
    auVar8 = auVar8 | auVar1;
    auVar11._0_8_ = auVar8._8_8_;
    auVar11._8_4_ = auVar8._0_4_;
    auVar11._12_4_ = auVar8._4_4_;
    uVar4 = -(ulong)(auVar11._0_8_ <= dVar9);
    uVar5 = -(ulong)(auVar11._8_8_ <= dVar10);
    dVar9 = (double)(~uVar4 & (ulong)dVar9 | (ulong)auVar11._0_8_ & uVar4);
    dVar10 = (double)(~uVar5 & auVar8._0_8_ | (ulong)dVar10 & uVar5);
    dVar7 = local_58;
  }
  else {
    dVar9 = INFINITY;
    dVar10 = -INFINITY;
    bVar2 = false;
  }
  __return_storage_ptr__->m_hasNaN = bVar2;
  __return_storage_ptr__->m_lo = dVar9;
  __return_storage_ptr__->m_hi = dVar10;
  if (pIVar3->m_hasNaN == true) {
    local_48.m_hasNaN = true;
    local_48.m_lo = INFINITY;
    local_48.m_hi = -INFINITY;
    tcu::Interval::operator|=(__return_storage_ptr__,&local_48);
    pIVar3 = iargs->a;
    dVar7 = pIVar3->m_lo;
    dVar6 = pIVar3->m_hi;
  }
  if (dVar7 <= dVar6) {
    modf(dVar7,&local_70);
    bVar2 = NAN(local_70);
    local_68 = INFINITY;
    if (!bVar2) {
      local_68 = local_70;
    }
    uStack_60 = 0;
    local_58 = -INFINITY;
    if (!bVar2) {
      local_58 = local_70;
    }
    uStack_50 = 0;
    modf(dVar6,&local_70);
    dVar7 = -INFINITY;
    dVar6 = INFINITY;
    if (!NAN(local_70)) {
      dVar7 = local_70;
      dVar6 = local_70;
    }
    bVar2 = bVar2 || NAN(local_70);
    dVar6 = (double)(~-(ulong)(local_68 <= dVar6) & (ulong)dVar6 |
                    (ulong)local_68 & -(ulong)(local_68 <= dVar6));
    dVar7 = (double)(~-(ulong)(dVar7 <= local_58) & (ulong)dVar7 |
                    (ulong)local_58 & -(ulong)(dVar7 <= local_58));
  }
  else {
    dVar7 = -INFINITY;
    dVar6 = INFINITY;
    bVar2 = false;
  }
  this_00->m_hasNaN = bVar2;
  this_00->m_lo = dVar6;
  this_00->m_hi = dVar7;
  if (pIVar3->m_hasNaN == true) {
    local_48.m_hasNaN = true;
    local_48.m_lo = INFINITY;
    local_48.m_hi = -INFINITY;
    tcu::Interval::operator|=(this_00,&local_48);
  }
  if ((iargs->a->m_lo == -INFINITY) || (iargs->a->m_hi == INFINITY)) {
    local_48.m_hasNaN = true;
    local_48.m_lo = INFINITY;
    local_48.m_hi = -INFINITY;
    tcu::Interval::operator|=(__return_storage_ptr__,&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply				(const EvalContext&, const IArgs& iargs) const
	{
		Interval	fracIV;
		Interval&	wholeIV		= const_cast<Interval&>(iargs.b);
		double		intPart		= 0;

		TCU_INTERVAL_APPLY_MONOTONE1(fracIV, x, iargs.a, frac, frac = deModf(x, &intPart));
		TCU_INTERVAL_APPLY_MONOTONE1(wholeIV, x, iargs.a, whole,
									 deModf(x, &intPart); whole = intPart);

		if (!iargs.a.isFinite())
		{
			// Behavior on modf(Inf) not well-defined, allow anything as a fractional part
			// See Khronos bug 13907
			fracIV |= TCU_NAN;
		}

		return fracIV;
	}